

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O0

void __thiscall SDLFB::~SDLFB(SDLFB *this)

{
  SDLFB *this_local;
  
  (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00b60be0;
  if (this->Renderer != (SDL_Renderer *)0x0) {
    if ((this->field_8).Texture != (SDL_Texture *)0x0) {
      SDL_DestroyTexture((this->field_8).Texture);
    }
    SDL_DestroyRenderer(this->Renderer);
  }
  if (this->Screen != (SDL_Window *)0x0) {
    SDL_DestroyWindow(this->Screen);
  }
  DFrameBuffer::~DFrameBuffer(&this->super_DFrameBuffer);
  return;
}

Assistant:

SDLFB::~SDLFB ()
{
	if (Renderer)
	{
		if (Texture)
			SDL_DestroyTexture (Texture);
		SDL_DestroyRenderer (Renderer);
	}

	if(Screen)
	{
		SDL_DestroyWindow (Screen);
	}
}